

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week11-hw-solution.cpp
# Opt level: O1

void print<std::__cxx11::list<int,std::allocator<int>>>(list<int,_std::allocator<int>_> *value)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (value->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var1 != (_List_node_base *)value;
      p_Var1 = (((_List_base<int,_std::allocator<int>_> *)&p_Var1->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(int *)&p_Var1[1]._M_next);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return;
}

Assistant:

void print(const T& value)
{
    if constexpr(IsContainer<T>)
    {
        for(const auto& item : value)
            std::cout << "[" << item << "]";
        std::cout << std::endl;
    }
    else
    {
        std::cout << value << std::endl;
    }
}